

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_heap_alloc_new(mi_heap_t *heap,size_t size)

{
  size_t in_RSI;
  mi_heap_t *in_RDI;
  void *p;
  size_t in_stack_ffffffffffffffd8;
  mi_heap_t *in_stack_ffffffffffffffe0;
  void *local_8;
  
  local_8 = mi_heap_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (void *)0x0) {
    local_8 = mi_heap_try_new(in_RDI,in_RSI,false);
  }
  return local_8;
}

Assistant:

void* mi_heap_alloc_new(mi_heap_t* heap, size_t size) {
  void* p = mi_heap_malloc(heap,size);
  if mi_unlikely(p == NULL) return mi_heap_try_new(heap, size, false);
  return p;
}